

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

UBool __thiscall
icu_63::Normalizer2Impl::getCanonStartSet(Normalizer2Impl *this,UChar32 c,UnicodeSet *set)

{
  uint16_t norm16;
  uint32_t uVar1;
  UnicodeSet *c_00;
  uint16_t *list;
  uint index;
  UBool UVar2;
  
  uVar1 = ucptrie_get_63(this->fCanonIterData->trie,c);
  if ((uVar1 & 0x7fffffff) == 0) {
    UVar2 = '\0';
  }
  else {
    UnicodeSet::clear(set);
    index = uVar1 & 0x1fffff;
    if ((uVar1 >> 0x15 & 1) == 0) {
      if (index != 0) {
        UnicodeSet::add(set,index);
      }
    }
    else {
      c_00 = (UnicodeSet *)UVector::elementAt(&this->fCanonIterData->canonStartSets,index);
      UnicodeSet::addAll(set,c_00);
    }
    UVar2 = '\x01';
    if ((uVar1 >> 0x1e & 1) != 0) {
      norm16 = getRawNorm16(this,c);
      if (norm16 == 2) {
        UnicodeSet::add(set,c * 0x24c + -0x266000,c * 0x24c + -0x265db5);
      }
      else {
        list = getCompositionsList(this,norm16);
        addComposites(this,list,set);
      }
    }
  }
  return UVar2;
}

Assistant:

UBool Normalizer2Impl::getCanonStartSet(UChar32 c, UnicodeSet &set) const {
    int32_t canonValue=getCanonValue(c)&~CANON_NOT_SEGMENT_STARTER;
    if(canonValue==0) {
        return FALSE;
    }
    set.clear();
    int32_t value=canonValue&CANON_VALUE_MASK;
    if((canonValue&CANON_HAS_SET)!=0) {
        set.addAll(getCanonStartSet(value));
    } else if(value!=0) {
        set.add(value);
    }
    if((canonValue&CANON_HAS_COMPOSITIONS)!=0) {
        uint16_t norm16=getRawNorm16(c);
        if(norm16==JAMO_L) {
            UChar32 syllable=
                (UChar32)(Hangul::HANGUL_BASE+(c-Hangul::JAMO_L_BASE)*Hangul::JAMO_VT_COUNT);
            set.add(syllable, syllable+Hangul::JAMO_VT_COUNT-1);
        } else {
            addComposites(getCompositionsList(norm16), set);
        }
    }
    return TRUE;
}